

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterUnix.h
# Opt level: O2

int __thiscall PixelToaster::UnixDisplay::close(UnixDisplay *this,int __fd)

{
  _XImage *p_Var1;
  int iVar2;
  
  p_Var1 = this->image_;
  if (p_Var1 != (_XImage *)0x0) {
    (*(p_Var1->f).destroy_image)(p_Var1);
    this->image_ = (XImage *)0x0;
  }
  if (this->display_ != (Display *)0x0) {
    if (this->window_ != 0) {
      XDestroyWindow();
      this->window_ = 0;
      if (this->display_ == (Display *)0x0) goto LAB_00107fe3;
    }
    XCloseDisplay();
    this->display_ = (Display *)0x0;
  }
LAB_00107fe3:
  iVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x12])(this);
  return iVar2;
}

Assistant:

void close() override
    {
        if (image_)
        {
            XDestroyImage(image_);
            image_ = 0;
        }

        if (display_ && window_)
        {
            XDestroyWindow(display_, window_);
            window_ = 0;
        }

        if (display_)
        {
            XCloseDisplay(display_);
            display_ = 0;
        }

        DisplayAdapter::close(); // note: this calls our virtual defaults method
    }